

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k054539.c
# Opt level: O0

void k054539_write_rom(void *chip,UINT32 offset,UINT32 length,UINT8 *data)

{
  k054539_state *info;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *chip_local;
  
  if (offset <= *(uint *)((long)chip + 0xb38)) {
    data_local._0_4_ = length;
    if (*(uint *)((long)chip + 0xb38) < offset + length) {
      data_local._0_4_ = *(int *)((long)chip + 0xb38) - offset;
    }
    memcpy((void *)(*(long *)((long)chip + 0xb30) + (ulong)offset),data,(ulong)(UINT32)data_local);
  }
  return;
}

Assistant:

static void k054539_write_rom(void *chip, UINT32 offset, UINT32 length, const UINT8* data)
{
	k054539_state *info = (k054539_state *)chip;
	
	if (offset > info->rom_size)
		return;
	if (offset + length > info->rom_size)
		length = info->rom_size - offset;
	
	memcpy(info->rom + offset, data, length);
	
	return;
}